

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O1

char * linenoise(char *prompt)

{
  ushort *puVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  ssize_t sVar8;
  size_t sVar9;
  int *piVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  char c;
  winsize ws;
  linenoiseCompletions lc;
  char buf [4096];
  byte local_10d2;
  byte local_10d1;
  ulong local_10d0;
  char local_10c8;
  byte local_10c7;
  ushort local_10c6 [3];
  linenoiseState local_10c0;
  linenoiseCompletions local_1068 [2];
  undefined1 local_1040 [8];
  char local_1038 [4104];
  
  pcVar7 = getenv("TERM");
  if (pcVar7 != (char *)0x0) {
    lVar15 = 0;
    do {
      iVar5 = strcasecmp(pcVar7,*(char **)((long)unsupported_term + lVar15));
      if (iVar5 == 0) {
        printf("%s",prompt);
        fflush(_stdout);
        pcVar7 = fgets(local_1038,0x1000,_stdin);
        if (pcVar7 == (char *)0x0) {
          return (char *)0x0;
        }
        for (sVar9 = strlen(local_1038);
            (sVar9 != 0 && ((local_1038[sVar9 - 1] == '\r' || (local_1038[sVar9 - 1] == '\n'))));
            sVar9 = sVar9 - 1) {
          local_1038[sVar9 - 1] = '\0';
        }
        goto LAB_00128dad;
      }
      lVar15 = lVar15 + 8;
    } while (lVar15 != 0x18);
  }
  iVar12 = 0;
  iVar5 = isatty(0);
  if (iVar5 == 0) {
    pcVar7 = fgets(local_1038,0x1000,_stdin);
    if (pcVar7 != (char *)0x0) {
      sVar9 = strlen(local_1038);
      iVar5 = (int)sVar9;
      if (iVar5 == 0) {
        iVar5 = 0;
      }
      else if (local_1038[iVar5 + -1] == '\n') {
        local_1038[(long)iVar5 + -1] = '\0';
        iVar5 = iVar5 + -1;
      }
      goto LAB_00128da8;
    }
  }
  else {
    iVar5 = enableRawMode(iVar12);
    if (iVar5 != -1) {
      local_10c0.ifd = 0;
      local_10c0.ofd = 1;
      local_10c0.buf = local_1038;
      local_10c0.buflen = 0x1000;
      local_10c0.prompt = prompt;
      local_10c0.plen = strlen(prompt);
      local_10c0.pos = 0;
      local_10c0.oldpos = 0;
      local_10c0.len = 0;
      iVar12 = 0x5413;
      iVar13 = 1;
      iVar5 = ioctl(1,0x5413,&local_10c8);
      if (local_10c6[0] == 0 || iVar5 == -1) {
        iVar5 = getCursorPosition(iVar13,iVar12);
        uVar14 = 0x50;
        if (iVar5 != -1) {
          iVar12 = 0x13aa1b;
          iVar13 = 1;
          sVar8 = write(1,"\x1b[999C",6);
          if (((sVar8 == 6) && (uVar6 = getCursorPosition(iVar13,iVar12), uVar6 != 0xffffffff)) &&
             (uVar14 = uVar6, iVar5 < (int)uVar6)) {
            snprintf((char *)local_1068,0x20,"\x1b[%dD");
            sVar9 = strlen((char *)local_1068);
            write(1,local_1068,sVar9);
          }
        }
      }
      else {
        uVar14 = (uint)local_10c6[0];
      }
      local_10c0.cols = (size_t)(int)uVar14;
      local_10c0.maxrows = 0;
      local_10c0.history_index = 0;
      *local_10c0.buf = '\0';
      local_10c0.buflen = local_10c0.buflen - 1;
      linenoiseHistoryAdd("");
      local_10d0 = write(local_10c0.ofd,prompt,local_10c0.plen);
      if (local_10d0 == 0xffffffffffffffff) {
        local_10d0 = 0xffffffff;
      }
      else {
        do {
          sVar8 = read(local_10c0.ifd,&local_10d2,1);
          if ((int)sVar8 < 1) {
LAB_00128b61:
            local_10d0 = local_10c0.len & 0xffffffff;
            goto LAB_00128b65;
          }
          if (completionCallback != (linenoiseCompletionCallback *)0x0 && local_10d2 == 9) {
            local_1068[0].len = 0;
            local_1068[0].cvec = (char **)0x0;
            local_10d1 = 0;
            (*completionCallback)(local_10c0.buf,local_1068);
            if (local_1068[0].len == 0) {
              fputc(7,_stderr);
              fflush(_stderr);
            }
            else {
              bVar4 = false;
              uVar11 = 0;
              do {
                sVar2 = local_10c0.len;
                sVar3 = local_10c0.pos;
                if (uVar11 < local_1068[0].len) {
                  local_1040 = (undefined1  [8])local_10c0.buf;
                  pcVar7 = local_1068[0].cvec[uVar11];
                  local_10c0.pos = strlen(pcVar7);
                  local_10c0.buf = pcVar7;
                  local_10c0.len = local_10c0.pos;
                  refreshLine(&local_10c0);
                  local_10c0.buf = (char *)local_1040;
                  local_10c0.pos = sVar3;
                  local_10c0.len = sVar2;
                }
                else {
                  refreshLine(&local_10c0);
                }
                sVar8 = read(local_10c0.ifd,&local_10d1,1);
                if ((int)sVar8 < 1) {
                  freeCompletions(local_1068);
                  local_10d2 = 0xff;
                  goto LAB_00128a90;
                }
                if (local_10d1 == 0x1b) {
                  bVar4 = true;
                  if (uVar11 < local_1068[0].len) {
                    refreshLine(&local_10c0);
                  }
                }
                else if (local_10d1 == 9) {
                  uVar11 = (uVar11 + 1) % (local_1068[0].len + 1);
                  if (uVar11 == local_1068[0].len) {
                    fputc(7,_stderr);
                    fflush(_stderr);
                  }
                }
                else {
                  bVar4 = true;
                  if (uVar11 < local_1068[0].len) {
                    iVar5 = snprintf(local_10c0.buf,local_10c0.buflen,"%s",
                                     local_1068[0].cvec[uVar11]);
                    local_10c0.pos = (size_t)iVar5;
                    local_10c0.len = local_10c0.pos;
                  }
                }
              } while (!bVar4);
            }
            freeCompletions(local_1068);
            local_10d2 = local_10d1;
LAB_00128a90:
            if ((char)local_10d2 < '\0') goto LAB_00128b61;
            if (local_10d2 != 0) goto LAB_00128aa3;
            bVar4 = false;
            goto LAB_00128d5d;
          }
LAB_00128aa3:
          sVar3 = local_10c0.pos;
          switch(local_10d2) {
          case 1:
switchD_00128ac0_caseD_1:
            if (local_10c0.pos != 0) {
              local_10c0.pos = 0;
              sVar3 = local_10c0.pos;
              goto LAB_00128d53;
            }
            break;
          case 2:
switchD_00128ac0_caseD_2:
            if (local_10c0.pos != 0) {
              sVar3 = local_10c0.pos - 1;
              goto LAB_00128d53;
            }
            break;
          case 3:
            piVar10 = __errno_location();
            *piVar10 = 0xb;
            goto LAB_00128cd5;
          case 4:
            if (local_10c0.len == 0) {
              lVar15 = (long)history_len;
              history_len = history_len + -1;
              free(history[lVar15 + -1]);
              goto LAB_00128cd5;
            }
LAB_00128b80:
            linenoiseEditDelete(&local_10c0);
            break;
          case 5:
switchD_00128ac0_caseD_5:
            sVar3 = local_10c0.len;
            if (local_10c0.pos != local_10c0.len) goto LAB_00128d53;
            break;
          case 6:
switchD_00128ac0_caseD_6:
            if (local_10c0.pos != local_10c0.len) {
LAB_00128d4b:
              sVar3 = local_10c0.pos + 1;
              goto LAB_00128d53;
            }
            break;
          case 7:
          case 9:
          case 10:
          case 0xf:
          case 0x11:
          case 0x12:
          case 0x13:
          case 0x16:
          case 0x18:
          case 0x19:
          case 0x1a:
            goto switchD_00128ac0_caseD_7;
          case 8:
switchD_00128ac0_caseD_8:
            linenoiseEditBackspace(&local_10c0);
            break;
          case 0xb:
            local_1038[local_10c0.pos] = '\0';
            local_10c0.len = local_10c0.pos;
            goto LAB_00128d53;
          case 0xc:
            write(1,"\x1b[H\x1b[2J",7);
            sVar3 = local_10c0.pos;
            goto LAB_00128d53;
          case 0xd:
            lVar15 = (long)history_len;
            history_len = history_len + -1;
            free(history[lVar15 + -1]);
            if ((mlmode != 0) && (local_10c0.pos != local_10c0.len)) {
              local_10c0.pos = local_10c0.len;
              refreshLine(&local_10c0);
            }
            goto LAB_00128b61;
          case 0xe:
switchD_00128ac0_caseD_e:
            iVar5 = 0;
            goto LAB_00128d38;
          case 0x10:
switchD_00128ac0_caseD_10:
            iVar5 = 1;
LAB_00128d38:
            linenoiseEditHistoryNext(&local_10c0,iVar5);
            break;
          case 0x14:
            if (local_10c0.pos < local_10c0.len && local_10c0.pos != 0) {
              puVar1 = (ushort *)(local_1038 + (local_10c0.pos - 1));
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
              if (local_10c0.pos != local_10c0.len - 1) goto LAB_00128d4b;
              goto LAB_00128d53;
            }
            break;
          case 0x15:
            local_1038[0] = '\0';
            local_10c0.len = 0;
            sVar3 = 0;
LAB_00128d53:
            local_10c0.pos = sVar3;
            refreshLine(&local_10c0);
            break;
          case 0x17:
            linenoiseEditDeletePrevWord(&local_10c0);
            break;
          case 0x1b:
            sVar8 = read(local_10c0.ifd,&local_10c8,1);
            if (sVar8 != -1) {
              sVar8 = read(local_10c0.ifd,&local_10c7,1);
              if (sVar8 != -1) {
                if (local_10c8 == 'O') {
                  if (local_10c7 == 0x46) goto switchD_00128ac0_caseD_5;
                  if (local_10c7 == 0x48) goto switchD_00128ac0_caseD_1;
                }
                else if (local_10c8 == '[') {
                  if ((byte)(local_10c7 - 0x30) < 10) {
                    sVar8 = read(local_10c0.ifd,local_10c6,1);
                    if (((sVar8 != -1) && ((char)local_10c6[0] == '~')) && (local_10c7 == 0x33))
                    goto LAB_00128b80;
                  }
                  else {
                    switch(local_10c7) {
                    case 0x41:
                      goto switchD_00128ac0_caseD_10;
                    case 0x42:
                      goto switchD_00128ac0_caseD_e;
                    case 0x43:
                      goto switchD_00128ac0_caseD_6;
                    case 0x44:
                      goto switchD_00128ac0_caseD_2;
                    case 0x46:
                      goto switchD_00128ac0_caseD_5;
                    case 0x48:
                      goto switchD_00128ac0_caseD_1;
                    }
                  }
                }
              }
            }
            break;
          default:
            if (local_10d2 == 0x7f) goto switchD_00128ac0_caseD_8;
switchD_00128ac0_caseD_7:
            iVar5 = linenoiseEditInsert(&local_10c0,local_10d2);
            if (iVar5 == 0) break;
LAB_00128cd5:
            local_10d0 = 0xffffffff;
LAB_00128b65:
            bVar4 = true;
            goto LAB_00128d5d;
          }
          bVar4 = false;
LAB_00128d5d:
        } while (!bVar4);
      }
      if ((rawmode == '\x01') && (iVar5 = tcsetattr(0,2,(termios *)&orig_termios), iVar5 != -1)) {
        rawmode = '\0';
      }
      putchar(10);
      iVar5 = (int)local_10d0;
      goto LAB_00128da8;
    }
  }
  iVar5 = -1;
LAB_00128da8:
  if (iVar5 == -1) {
    return (char *)0x0;
  }
LAB_00128dad:
  pcVar7 = strdup(local_1038);
  return pcVar7;
}

Assistant:

char *linenoise(const char *prompt) {
	char buf[LINENOISE_MAX_LINE];
	int count;

	if (isUnsupportedTerm()) {
		size_t len;

		printf("%s",prompt);
		fflush(stdout);
		if (fgets(buf,LINENOISE_MAX_LINE,stdin) == NULL) return NULL;
		len = strlen(buf);
		while(len && (buf[len-1] == '\n' || buf[len-1] == '\r')) {
			len--;
			buf[len] = '\0';
		}
		return strdup(buf);
	} else {
		count = linenoiseRaw(buf,LINENOISE_MAX_LINE,prompt);
		if (count == -1) return NULL;
		return strdup(buf);
	}
}